

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_bary4(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  int iVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar23;
  undefined1 auVar22 [16];
  double dVar24;
  double dVar25;
  double dVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  REF_DBL volume;
  REF_DBL local_40;
  double local_38;
  double dStack_30;
  
  iVar10 = *nodes;
  if (((-1 < (long)iVar10) && (iVar1 = ref_node->max, iVar10 < iVar1)) &&
     (pRVar4 = ref_node->global, -1 < pRVar4[iVar10])) {
    uVar8 = nodes[1];
    if (((int)uVar8 < iVar1 && -1 < (int)uVar8) && (-1 < pRVar4[uVar8])) {
      uVar2 = nodes[2];
      if (((int)uVar2 < iVar1 && -1 < (int)uVar2) && (-1 < pRVar4[uVar2])) {
        uVar3 = nodes[3];
        if (((int)uVar3 < iVar1 && -1 < (int)uVar3) && (-1 < pRVar4[uVar3])) {
          pRVar5 = ref_node->real;
          uVar15 = (ulong)(uVar8 * 0xf);
          uVar12 = (ulong)(uVar2 * 0xf);
          uVar14 = (ulong)(uVar3 * 0xf);
          dVar17 = pRVar5[uVar15 + 2] - pRVar5[uVar14 + 2];
          dVar25 = pRVar5[uVar14];
          dVar24 = (pRVar5 + uVar14)[1];
          dVar21 = pRVar5[uVar12 + 1] - pRVar5[uVar14 + 1];
          dVar23 = (pRVar5 + uVar12 + 1)[1] - (pRVar5 + uVar14 + 1)[1];
          dVar19 = pRVar5[uVar15] - dVar25;
          dVar20 = (pRVar5 + uVar15)[1] - dVar24;
          dStack_30 = (dVar20 * dVar23 - dVar17 * dVar21) * (*xyz - dVar25);
          uVar13 = (ulong)(uint)(iVar10 * 0xf);
          auVar18._0_8_ =
               (dStack_30 -
               (dVar23 * dVar19 + -(pRVar5[uVar12] - dVar25) * dVar17) * (xyz[1] - dVar24)) +
               (dVar19 * dVar21 - dVar20 * (pRVar5[uVar12] - dVar25)) *
               (xyz[2] - pRVar5[uVar14 + 2]);
          *bary = auVar18._0_8_;
          dVar17 = xyz[2] - pRVar5[uVar14 + 2];
          dVar25 = pRVar5[uVar14];
          dVar24 = (pRVar5 + uVar14)[1];
          dVar20 = pRVar5[uVar12 + 1] - pRVar5[uVar14 + 1];
          dVar21 = (pRVar5 + uVar12 + 1)[1] - (pRVar5 + uVar14 + 1)[1];
          dVar19 = xyz[1] - dVar24;
          dVar17 = ((dVar19 * dVar21 - dVar17 * dVar20) * (pRVar5[uVar13] - dVar25) -
                   (dVar21 * (*xyz - dVar25) + -(pRVar5[uVar12] - dVar25) * dVar17) *
                   (pRVar5[uVar13 + 1] - dVar24)) +
                   ((*xyz - dVar25) * dVar20 - dVar19 * (pRVar5[uVar12] - dVar25)) *
                   (pRVar5[uVar13 + 2] - pRVar5[uVar14 + 2]);
          bary[1] = dVar17;
          dVar19 = pRVar5[uVar15 + 2] - pRVar5[uVar14 + 2];
          dVar25 = pRVar5[uVar14];
          dVar24 = (pRVar5 + uVar14)[1];
          dVar23 = xyz[1] - pRVar5[uVar14 + 1];
          dVar28 = xyz[2] - (pRVar5 + uVar14 + 1)[1];
          dVar20 = pRVar5[uVar15] - dVar25;
          dVar21 = (pRVar5 + uVar15)[1] - dVar24;
          auVar22._0_8_ =
               ((dVar21 * dVar28 - dVar19 * dVar23) * (pRVar5[uVar13] - dVar25) -
               (dVar28 * dVar20 + -(*xyz - dVar25) * dVar19) * (pRVar5[uVar13 + 1] - dVar24)) +
               (dVar20 * dVar23 - dVar21 * (*xyz - dVar25)) *
               (pRVar5[uVar13 + 2] - pRVar5[uVar14 + 2]);
          bary[2] = auVar22._0_8_;
          dVar24 = pRVar5[uVar15 + 2] - xyz[2];
          dVar25 = *xyz;
          dVar21 = pRVar5[uVar12 + 1] - xyz[1];
          dVar23 = (pRVar5 + uVar12 + 1)[1] - xyz[2];
          dVar19 = pRVar5[uVar15] - dVar25;
          dVar20 = (pRVar5 + uVar15)[1] - xyz[1];
          dVar25 = ((dVar20 * dVar23 - dVar24 * dVar21) * (pRVar5[uVar13] - dVar25) -
                   (dVar23 * dVar19 + -(pRVar5[uVar12] - dVar25) * dVar24) *
                   (pRVar5[uVar13 + 1] - xyz[1])) +
                   (dVar19 * dVar21 - dVar20 * (pRVar5[uVar12] - dVar25)) *
                   (pRVar5[uVar13 + 2] - xyz[2]);
          bary[3] = dVar25;
          local_38 = auVar18._0_8_ + dVar17 + auVar22._0_8_ + dVar25;
          auVar26._0_8_ = local_38 * 1e+20;
          auVar26._8_8_ = auVar18._0_8_;
          auVar27._8_8_ = -auVar18._0_8_;
          auVar27._0_8_ = -auVar26._0_8_;
          auVar27 = maxpd(auVar26,auVar27);
          dVar24 = auVar27._0_8_;
          if (auVar27._8_8_ < dVar24) {
            dVar19 = dVar17;
            if (dVar17 <= -dVar17) {
              dVar19 = -dVar17;
            }
            if (dVar19 < dVar24) {
              dVar19 = auVar22._0_8_;
              if (auVar22._0_8_ <= -auVar22._0_8_) {
                dVar19 = -auVar22._0_8_;
              }
              if (dVar19 < dVar24) {
                dVar19 = dVar25;
                if (dVar25 <= -dVar25) {
                  dVar19 = -dVar25;
                }
                if (dVar19 < dVar24) {
                  auVar18._8_8_ = dVar17;
                  auVar6._8_8_ = local_38;
                  auVar6._0_8_ = local_38;
                  auVar27 = divpd(auVar18,auVar6);
                  *(undefined1 (*) [16])bary = auVar27;
                  auVar22._8_8_ = dVar25;
                  auVar7._8_8_ = local_38;
                  auVar7._0_8_ = local_38;
                  auVar27 = divpd(auVar22,auVar7);
                  *(undefined1 (*) [16])(bary + 2) = auVar27;
                  return 0;
                }
              }
            }
          }
          uVar8 = ref_node_tet_vol(ref_node,nodes,&local_40);
          if (uVar8 == 0) {
            printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",local_38,*bary
                   ,bary[1],bary[2],bary[3],
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xb6d);
            iVar10 = 0;
            lVar9 = 1;
            do {
              iVar1 = (int)lVar9;
              if (bary[iVar10] < bary[lVar9] || bary[iVar10] == bary[lVar9]) {
                iVar1 = iVar10;
              }
              iVar10 = iVar1;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            bary[2] = 0.0;
            bary[3] = 0.0;
            *bary = 0.0;
            bary[1] = 0.0;
            bary[iVar10] = -1.0;
            uVar8 = ref_node_tet_vol(ref_node,nodes,&local_40);
            if (uVar8 == 0) {
              printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n",local_40,*bary,bary[1],
                     bary[2],bary[3]);
              return 4;
            }
            uVar11 = 0xb75;
          }
          else {
            uVar11 = 0xb6b;
          }
          pcVar16 = "bary vol chk";
          uVar15 = (ulong)uVar8;
          goto LAB_0014a3fd;
        }
      }
    }
  }
  pcVar16 = "node invalid";
  uVar8 = 3;
  uVar11 = 0xb2f;
  uVar15 = 3;
LAB_0014a3fd:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
         "ref_node_bary4",uVar15,pcVar16);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary4(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL total, m11, m12, m13;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  a = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[0] = (m11 - m12 + m13);
  a = ref_node_xyz_ptr(ref_node, nodes[0]);

  b = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[1] = (m11 - m12 + m13);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);

  c = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[2] = (m11 - m12 + m13);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);

  d = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[3] = (m11 - m12 + m13);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_DBL volume;
    REF_INT i, smallest;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2],
           bary[3]);
    /* for walking set the smallest as the direction */
    smallest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] < bary[smallest]) smallest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[smallest] = -1.0;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n", volume,
           bary[0], bary[1], bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}